

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState *obj,int idx)

{
  uint uVar1;
  ImGuiInputTextFlags IVar2;
  uint uVar3;
  unsigned_short *puVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  short local_34;
  
  uVar1 = obj->CurLenW;
  uVar6 = idx + 1;
  uVar7 = uVar6;
  if ((int)uVar6 < (int)uVar1) {
    IVar2 = obj->Flags;
    do {
      local_34 = (short)IVar2;
      if (-1 < local_34) {
        uVar7 = uVar6;
        if ((int)(uVar6 - 1) < 0) break;
        uVar3 = (obj->TextW).Size;
        if ((int)uVar3 <= (int)(uVar6 - 1)) {
LAB_0018270f:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                        ,0x702,"T &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
        }
        puVar4 = (obj->TextW).Data;
        bVar5 = is_separator((uint)puVar4[(ulong)uVar6 - 1]);
        if (!bVar5) {
          if (uVar3 <= uVar6) goto LAB_0018270f;
          bVar5 = is_separator((uint)puVar4[uVar6]);
          if (bVar5) break;
        }
      }
      uVar6 = uVar6 + 1;
      uVar7 = uVar1;
    } while (uVar1 != uVar6);
  }
  if ((int)uVar7 < (int)uVar1) {
    uVar1 = uVar7;
  }
  return uVar1;
}

Assistant:

static int  STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState* obj, int idx)   { idx++; int len = obj->CurLenW; while (idx < len && !is_word_boundary_from_left(obj, idx)) idx++; return idx > len ? len : idx; }